

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void do_cmd_options_win(char *name,wchar_t row)

{
  unkuint9 Var1;
  mouseclick mVar2;
  int iVar3;
  keycode_t kVar4;
  uint uVar5;
  wchar_t wVar6;
  size_t sVar7;
  byte bVar8;
  uint8_t uVar10;
  ui_event uVar9;
  keypress ch;
  uint32_t flag;
  wchar_t choicex;
  wchar_t choicey;
  wchar_t local_7c;
  char *pcStack_78;
  wchar_t c;
  char *str;
  uint8_t a_1;
  char *s;
  uint32_t local_58;
  uint8_t a;
  uint32_t new_flags [8];
  undefined4 uStack_30;
  ui_event ke;
  wchar_t x;
  wchar_t y;
  wchar_t d;
  wchar_t j;
  wchar_t i;
  wchar_t row_local;
  char *name_local;
  undefined5 uVar11;
  
  ke._8_4_ = 0;
  ke.key.code = 0;
  for (y = L'\0'; y < L'\b'; y = y + L'\x01') {
    (&local_58)[y] = window_flag[y];
  }
  screen_save();
  clear_from(L'\0');
  mVar2 = stack0xffffffffffffffcc;
  while( true ) {
    do {
      while( true ) {
        stack0xffffffffffffffcc = mVar2;
        prt("Window flags (<dir> to move, \'t\'/Enter to toggle, or ESC)",L'\0',L'\0');
        for (y = L'\0'; y < L'\b'; y = y + L'\x01') {
          s._7_1_ = 1;
          if (y == ke.key.code) {
            s._7_1_ = 0xe;
          }
          sVar7 = strlen(angband_term_name[y]);
          Term_putstr((y * 5 + 0x23) - (int)(sVar7 >> 1),y % 2 + L'\x02',L'\xffffffff',(uint)s._7_1_
                      ,angband_term_name[y]);
        }
        for (d = L'\0'; d < L'\x10'; d = d + L'\x01') {
          str._7_1_ = 1;
          pcStack_78 = window_flag_desc[d];
          if (d == ke._8_4_) {
            str._7_1_ = 0xe;
          }
          if (pcStack_78 == (char *)0x0) {
            pcStack_78 = "(Unused option)";
          }
          Term_putstr(L'\0',d + L'\x05',L'\xffffffff',(uint)str._7_1_,pcStack_78);
          for (y = L'\0'; y < L'\b'; y = y + L'\x01') {
            local_7c = L'.';
            str._7_1_ = 1;
            if ((d == ke._8_4_) && (y == ke.key.code)) {
              str._7_1_ = 0xe;
            }
            if (((&local_58)[y] & 1 << ((byte)d & 0x1f)) != 0) {
              local_7c = L'X';
            }
            Term_putch(y * 5 + L'#',d + L'\x05',(uint)str._7_1_,local_7c);
          }
        }
        Term_gotoxy(ke.key.code * 5 + L'#',ke._8_4_ + L'\x05');
        uVar9 = inkey_ex();
        stack0xffffffffffffffcc = uVar9.mouse;
        mVar2 = stack0xffffffffffffffcc;
        new_flags[7] = uVar9._0_4_;
        bVar8 = (byte)ke._8_4_;
        unique0x1000055d = mVar2;
        if (new_flags[7] != 2) break;
        uStack_30._1_1_ = uVar9.key.code._1_1_;
        iVar3 = uStack_30._1_1_ - 5;
        uStack_30._0_1_ = (byte)uVar9.key.code;
        kVar4 = (int)((byte)uStack_30 - 0x23) / 5;
        uStack_30._2_1_ = uVar9.key.code._2_1_;
        if (uStack_30._2_1_ == '\x02') goto LAB_00265bd5;
        if ((((-1 < iVar3) && (iVar3 < 0x10)) && (0 < (int)kVar4)) &&
           (((int)kVar4 < 8 && ((uint)(byte)uStack_30 % 5 == 0)))) {
          if ((iVar3 == ke._8_4_) && (kVar4 == ke.key.code)) {
            uVar5 = 1 << (bVar8 & 0x1f);
            if (((&local_58)[(int)ke.key.code] & uVar5) == 0) {
              (&local_58)[(int)ke.key.code] = uVar5 | (&local_58)[(int)ke.key.code];
              mVar2 = stack0xffffffffffffffcc;
            }
            else {
              (&local_58)[(int)ke.key.code] = (uVar5 ^ 0xffffffff) & (&local_58)[(int)ke.key.code];
              mVar2 = stack0xffffffffffffffcc;
            }
          }
          else {
            ke.key.code = (int)((byte)uStack_30 - 0x23) / 5;
            ke._8_4_ = iVar3;
          }
        }
      }
    } while (new_flags[7] != 1);
    uStack_30 = uVar9.key.code;
    if ((uStack_30 == 0xe000) || (uStack_30 == 0x71)) break;
    if ((uStack_30 == 0x35) || ((uStack_30 == 0x74 || (uStack_30 == 0x9c)))) {
      if (ke.key.code == 0) {
        bell();
        mVar2 = stack0xffffffffffffffcc;
      }
      else if (((&local_58)[(int)ke.key.code] & 1 << (bVar8 & 0x1f)) == 0) {
        (&local_58)[(int)ke.key.code] = 1 << (bVar8 & 0x1f) | (&local_58)[(int)ke.key.code];
        mVar2 = stack0xffffffffffffffcc;
      }
      else {
        (&local_58)[(int)ke.key.code] =
             (1 << (bVar8 & 0x1f) ^ 0xffffffffU) & (&local_58)[(int)ke.key.code];
        mVar2 = stack0xffffffffffffffcc;
      }
    }
    else {
      Var1 = uVar9._0_9_;
      ch._9_3_ = 0;
      ch.type = (int)Var1;
      register0x0000003c = (int)(Var1 >> 0x20);
      register0x00000030 = (char)(Var1 >> 0x40);
      wVar6 = target_dir(ch);
      mVar2 = stack0xffffffffffffffcc;
      if (wVar6 != L'\0') {
        ke.key.code = (int)(ke.key.code + (int)ddx[wVar6] + 8) % 8;
        ke._8_4_ = (ke._8_4_ + (int)ddy[wVar6] + 0x10) % 0x10;
      }
    }
  }
LAB_00265bd5:
  subwindows_set_flags(&local_58,8);
  screen_load();
  return;
}

Assistant:

static void do_cmd_options_win(const char *name, int row)
{
	int i, j, d;
	int y = 0;
	int x = 0;
	ui_event ke;
	uint32_t new_flags[ANGBAND_TERM_MAX];

	/* Set new flags to the old values */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
		new_flags[j] = window_flag[j];

	/* Clear screen */
	screen_save();
	clear_from(0);

	/* Interact */
	while (1) {
		/* Prompt */
		prt("Window flags (<dir> to move, 't'/Enter to toggle, or ESC)", 0, 0);

		/* Display the windows */
		for (j = 0; j < ANGBAND_TERM_MAX; j++) {
			uint8_t a = COLOUR_WHITE;

			const char *s = angband_term_name[j];

			/* Use color */
			if (j == x) a = COLOUR_L_BLUE;

			/* Window name, staggered, centered */
			Term_putstr(35 + j * 5 - strlen(s) / 2, 2 + j % 2, -1, a, s);
		}

		/* Display the options */
		for (i = 0; i < PW_MAX_FLAGS; i++) {
			uint8_t a = COLOUR_WHITE;

			const char *str = window_flag_desc[i];

			/* Use color */
			if (i == y) a = COLOUR_L_BLUE;

			/* Unused option */
			if (!str) str = "(Unused option)";

			/* Flag name */
			Term_putstr(0, i + 5, -1, a, str);

			/* Display the windows */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				wchar_t c = L'.';

				a = COLOUR_WHITE;

				/* Use color */
				if ((i == y) && (j == x)) a = COLOUR_L_BLUE;

				/* Active flag */
				if (new_flags[j] & ((uint32_t) 1 << i)) c = L'X';

				/* Flag value */
				Term_putch(35 + j * 5, i + 5, a, c);
			}
		}

		/* Place Cursor */
		Term_gotoxy(35 + x * 5, y + 5);

		/* Get key */
		ke = inkey_ex();

		/* Mouse or keyboard interaction */
		if (ke.type == EVT_MOUSE) {
			int choicey = ke.mouse.y - 5;
			int choicex = (ke.mouse.x - 35)/5;

			if (ke.mouse.button == 2)
				break;

			if ((choicey >= 0) && (choicey < PW_MAX_FLAGS)
				&& (choicex > 0) && (choicex < ANGBAND_TERM_MAX)
				&& !(ke.mouse.x % 5)) {
				if ((choicey == y) && (choicex == x)) {
					uint32_t flag = ((uint32_t) 1) << y;

					/* Toggle flag (off) */
					if (new_flags[x] & flag)
						new_flags[x] &= ~flag;
					/* Toggle flag (on) */
					else
						new_flags[x] |= flag;
				} else {
					y = choicey;
					x = (ke.mouse.x - 35)/5;
				}
			}
		} else if (ke.type == EVT_KBRD) {
			if (ke.key.code == ESCAPE || ke.key.code == 'q')
				break;

			/* Toggle */
			else if (ke.key.code == '5' || ke.key.code == 't' ||
					ke.key.code == KC_ENTER) {
				/* Hack -- ignore the main window */
				if (x == 0)
					bell();

				/* Toggle flag (off) */
				else if (new_flags[x] & (((uint32_t) 1) << y))
					new_flags[x] &= ~(((uint32_t) 1) << y);

				/* Toggle flag (on) */
				else
					new_flags[x] |= (((uint32_t) 1) << y);

				/* Continue */
				continue;
			}

			/* Extract direction */
			d = target_dir(ke.key);

			/* Move */
			if (d != 0) {
				x = (x + ddx[d] + 8) % ANGBAND_TERM_MAX;
				y = (y + ddy[d] + 16) % PW_MAX_FLAGS;
			}
		}
	}

	/* Notice changes */
	subwindows_set_flags(new_flags, ANGBAND_TERM_MAX);

	screen_load();
}